

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PpTokens.cpp
# Opt level: O2

bool __thiscall
glslang::TPpContext::TokenStream::peekTokenizedPasting(TokenStream *this,bool lastTokenPastes)

{
  bool bVar1;
  ulong uVar2;
  ulong uVar3;
  bool bVar4;
  
  uVar3 = this->currentPos;
  while (bVar1 = peekToken(this,0x20), bVar1) {
    this->currentPos = this->currentPos + 1;
  }
  bVar1 = peekToken(this,0x97);
  bVar4 = true;
  if (!bVar1) {
    if (!lastTokenPastes) {
      return false;
    }
    uVar3 = this->currentPos;
    uVar2 = uVar3;
    while ((bVar4 = (ulong)(((long)(this->stream).
                                   super_vector<glslang::TPpContext::TokenStream::Token,_glslang::pool_allocator<glslang::TPpContext::TokenStream::Token>_>
                                   .
                                   super__Vector_base<glslang::TPpContext::TokenStream::Token,_glslang::pool_allocator<glslang::TPpContext::TokenStream::Token>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(this->stream).
                                  super_vector<glslang::TPpContext::TokenStream::Token,_glslang::pool_allocator<glslang::TPpContext::TokenStream::Token>_>
                                  .
                                  super__Vector_base<glslang::TPpContext::TokenStream::Token,_glslang::pool_allocator<glslang::TPpContext::TokenStream::Token>_>
                                  ._M_impl.super__Vector_impl_data._M_start) / 0x38) <= uVar2,
           !bVar4 && (bVar1 = peekToken(this,0x20), bVar1))) {
      uVar2 = this->currentPos + 1;
      this->currentPos = uVar2;
    }
  }
  this->currentPos = uVar3;
  return bVar4;
}

Assistant:

bool TPpContext::TokenStream::peekTokenizedPasting(bool lastTokenPastes)
{
    // 1. preceding ##?

    size_t savePos = currentPos;
    // skip white space
    while (peekToken(' '))
        ++currentPos;
    if (peekToken(PpAtomPaste)) {
        currentPos = savePos;
        return true;
    }

    // 2. last token and we've been told after this there will be a ##

    if (! lastTokenPastes)
        return false;
    // Getting here means the last token will be pasted, after this

    // Are we at the last non-whitespace token?
    savePos = currentPos;
    bool moreTokens = false;
    do {
        if (atEnd())
            break;
        if (!peekToken(' ')) {
            moreTokens = true;
            break;
        }
        ++currentPos;
    } while (true);
    currentPos = savePos;

    return !moreTokens;
}